

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O2

void metal_texld(Context *ctx,int texldd)

{
  uint uVar1;
  int iVar2;
  uint32 uVar3;
  int iVar4;
  RegisterList *pRVar5;
  size_t in_RCX;
  char *pcVar6;
  size_t len;
  size_t in_R8;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  char src2 [64];
  char swiz_str [6];
  char src0 [64];
  char src3 [64];
  char proj [64];
  char bias [64];
  char code [128];
  char src1 [64];
  
  ctx->metal_need_header_texture = 1;
  iVar2 = shader_version_atleast(ctx,'\x01','\x04');
  if (iVar2 == 0) {
    code[0x70] = '\0';
    code[0x71] = '\0';
    code[0x72] = '\0';
    code[0x73] = '\0';
    code[0x74] = '\0';
    code[0x75] = '\0';
    code[0x76] = '\0';
    code[0x77] = '\0';
    code[0x78] = '\0';
    code[0x79] = '\0';
    code[0x7a] = '\0';
    code[0x7b] = '\0';
    code[0x7c] = '\0';
    code[0x7d] = '\0';
    code[0x7e] = '\0';
    code[0x7f] = '\0';
    code[0x60] = '\0';
    code[0x61] = '\0';
    code[0x62] = '\0';
    code[99] = '\0';
    code[100] = '\0';
    code[0x65] = '\0';
    code[0x66] = '\0';
    code[0x67] = '\0';
    code[0x68] = '\0';
    code[0x69] = '\0';
    code[0x6a] = '\0';
    code[0x6b] = '\0';
    code[0x6c] = '\0';
    code[0x6d] = '\0';
    code[0x6e] = '\0';
    code[0x6f] = '\0';
    code[0x50] = '\0';
    code[0x51] = '\0';
    code[0x52] = '\0';
    code[0x53] = '\0';
    code[0x54] = '\0';
    code[0x55] = '\0';
    code[0x56] = '\0';
    code[0x57] = '\0';
    code[0x58] = '\0';
    code[0x59] = '\0';
    code[0x5a] = '\0';
    code[0x5b] = '\0';
    code[0x5c] = '\0';
    code[0x5d] = '\0';
    code[0x5e] = '\0';
    code[0x5f] = '\0';
    code[0x40] = '\0';
    code[0x41] = '\0';
    code[0x42] = '\0';
    code[0x43] = '\0';
    code[0x44] = '\0';
    code[0x45] = '\0';
    code[0x46] = '\0';
    code[0x47] = '\0';
    code[0x48] = '\0';
    code[0x49] = '\0';
    code[0x4a] = '\0';
    code[0x4b] = '\0';
    code[0x4c] = '\0';
    code[0x4d] = '\0';
    code[0x4e] = '\0';
    code[0x4f] = '\0';
    code[0x30] = '\0';
    code[0x31] = '\0';
    code[0x32] = '\0';
    code[0x33] = '\0';
    code[0x34] = '\0';
    code[0x35] = '\0';
    code[0x36] = '\0';
    code[0x37] = '\0';
    code[0x38] = '\0';
    code[0x39] = '\0';
    code[0x3a] = '\0';
    code[0x3b] = '\0';
    code[0x3c] = '\0';
    code[0x3d] = '\0';
    code[0x3e] = '\0';
    code[0x3f] = '\0';
    code[0x20] = '\0';
    code[0x21] = '\0';
    code[0x22] = '\0';
    code[0x23] = '\0';
    code[0x24] = '\0';
    code[0x25] = '\0';
    code[0x26] = '\0';
    code[0x27] = '\0';
    code[0x28] = '\0';
    code[0x29] = '\0';
    code[0x2a] = '\0';
    code[0x2b] = '\0';
    code[0x2c] = '\0';
    code[0x2d] = '\0';
    code[0x2e] = '\0';
    code[0x2f] = '\0';
    code[0x10] = '\0';
    code[0x11] = '\0';
    code[0x12] = '\0';
    code[0x13] = '\0';
    code[0x14] = '\0';
    code[0x15] = '\0';
    code[0x16] = '\0';
    code[0x17] = '\0';
    code[0x18] = '\0';
    code[0x19] = '\0';
    code[0x1a] = '\0';
    code[0x1b] = '\0';
    code[0x1c] = '\0';
    code[0x1d] = '\0';
    code[0x1e] = '\0';
    code[0x1f] = '\0';
    code[0] = '\0';
    code[1] = '\0';
    code[2] = '\0';
    code[3] = '\0';
    code[4] = '\0';
    code[5] = '\0';
    code[6] = '\0';
    code[7] = '\0';
    code[8] = '\0';
    code[9] = '\0';
    code[10] = '\0';
    code[0xb] = '\0';
    code[0xc] = '\0';
    code[0xd] = '\0';
    code[0xe] = '\0';
    code[0xf] = '\0';
    if (texldd != 0) {
      __assert_fail("!texldd",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                    ,0x164e,"void metal_texld(Context *, const int)");
    }
    pRVar5 = reglist_find(&ctx->samplers,REG_TYPE_SAMPLER,(ctx->dest_arg).regnum);
    if (pRVar5 == (RegisterList *)0x0) {
      builtin_strncpy(src2,"xyz",4);
    }
    else {
      builtin_strncpy(src2,"xyz",4);
      if (pRVar5->index == 2) {
        src2[0] = 'x';
        src2[1] = 'y';
        src2[2] = '\0';
      }
    }
    get_METAL_destarg_varname(ctx,src0,len);
    get_METAL_varname_in_buf(ctx,REG_TYPE_SAMPLER,(ctx->dest_arg).regnum,src1,in_R8);
    make_METAL_destarg_assign(ctx,code,0x80,"%s_texture.sample(%s, %s.%s)",src1,src1,src0,src2);
  }
  else {
    iVar2 = shader_version_atleast(ctx,'\x02','\0');
    if (iVar2 == 0) {
      fail(ctx,"TEXLD == Shader Model 1.4 unimplemented.");
      return;
    }
    pRVar5 = reglist_find(&ctx->samplers,REG_TYPE_SAMPLER,ctx->source_args[1].regnum);
    src0[0x30] = '\0';
    src0[0x31] = '\0';
    src0[0x32] = '\0';
    src0[0x33] = '\0';
    src0[0x34] = '\0';
    src0[0x35] = '\0';
    src0[0x36] = '\0';
    src0[0x37] = '\0';
    src0[0x38] = '\0';
    src0[0x39] = '\0';
    src0[0x3a] = '\0';
    src0[0x3b] = '\0';
    src0[0x3c] = '\0';
    src0[0x3d] = '\0';
    src0[0x3e] = '\0';
    src0[0x3f] = '\0';
    src0[0x20] = '\0';
    src0[0x21] = '\0';
    src0[0x22] = '\0';
    src0[0x23] = '\0';
    src0[0x24] = '\0';
    src0[0x25] = '\0';
    src0[0x26] = '\0';
    src0[0x27] = '\0';
    src0[0x28] = '\0';
    src0[0x29] = '\0';
    src0[0x2a] = '\0';
    src0[0x2b] = '\0';
    src0[0x2c] = '\0';
    src0[0x2d] = '\0';
    src0[0x2e] = '\0';
    src0[0x2f] = '\0';
    src0[0x10] = '\0';
    src0[0x11] = '\0';
    src0[0x12] = '\0';
    src0[0x13] = '\0';
    src0[0x14] = '\0';
    src0[0x15] = '\0';
    src0[0x16] = '\0';
    src0[0x17] = '\0';
    src0[0x18] = '\0';
    src0[0x19] = '\0';
    src0[0x1a] = '\0';
    src0[0x1b] = '\0';
    src0[0x1c] = '\0';
    src0[0x1d] = '\0';
    src0[0x1e] = '\0';
    src0[0x1f] = '\0';
    src0[0] = '\0';
    src0[1] = '\0';
    src0[2] = '\0';
    src0[3] = '\0';
    src0[4] = '\0';
    src0[5] = '\0';
    src0[6] = '\0';
    src0[7] = '\0';
    src0[8] = '\0';
    src0[9] = '\0';
    src0[10] = '\0';
    src0[0xb] = '\0';
    src0[0xc] = '\0';
    src0[0xd] = '\0';
    src0[0xe] = '\0';
    src0[0xf] = '\0';
    get_METAL_srcarg_varname(ctx,1,src1,in_RCX);
    src2[0x30] = '\0';
    src2[0x31] = '\0';
    src2[0x32] = '\0';
    src2[0x33] = '\0';
    src2[0x34] = '\0';
    src2[0x35] = '\0';
    src2[0x36] = '\0';
    src2[0x37] = '\0';
    src2[0x38] = '\0';
    src2[0x39] = '\0';
    src2[0x3a] = '\0';
    src2[0x3b] = '\0';
    src2[0x3c] = '\0';
    src2[0x3d] = '\0';
    src2[0x3e] = '\0';
    src2[0x3f] = '\0';
    src2[0x20] = '\0';
    src2[0x21] = '\0';
    src2[0x22] = '\0';
    src2[0x23] = '\0';
    src2[0x24] = '\0';
    src2[0x25] = '\0';
    src2[0x26] = '\0';
    src2[0x27] = '\0';
    src2[0x28] = '\0';
    src2[0x29] = '\0';
    src2[0x2a] = '\0';
    src2[0x2b] = '\0';
    src2[0x2c] = '\0';
    src2[0x2d] = '\0';
    src2[0x2e] = '\0';
    src2[0x2f] = '\0';
    src2[0x10] = '\0';
    src2[0x11] = '\0';
    src2[0x12] = '\0';
    src2[0x13] = '\0';
    src2[0x14] = '\0';
    src2[0x15] = '\0';
    src2[0x16] = '\0';
    src2[0x17] = '\0';
    src2[0x18] = '\0';
    src2[0x19] = '\0';
    src2[0x1a] = '\0';
    src2[0x1b] = '\0';
    src2[0x1c] = '\0';
    src2[0x1d] = '\0';
    src2[0x1e] = '\0';
    src2[0x1f] = '\0';
    src2[0] = '\0';
    src2[1] = '\0';
    src2[2] = '\0';
    src2[3] = '\0';
    src2[4] = '\0';
    src2[5] = '\0';
    src2[6] = '\0';
    src2[7] = '\0';
    src2[8] = '\0';
    src2[9] = '\0';
    src2[10] = '\0';
    src2[0xb] = '\0';
    src2[0xc] = '\0';
    src2[0xd] = '\0';
    src2[0xe] = '\0';
    src2[0xf] = '\0';
    src3[0x30] = '\0';
    src3[0x31] = '\0';
    src3[0x32] = '\0';
    src3[0x33] = '\0';
    src3[0x34] = '\0';
    src3[0x35] = '\0';
    src3[0x36] = '\0';
    src3[0x37] = '\0';
    src3[0x38] = '\0';
    src3[0x39] = '\0';
    src3[0x3a] = '\0';
    src3[0x3b] = '\0';
    src3[0x3c] = '\0';
    src3[0x3d] = '\0';
    src3[0x3e] = '\0';
    src3[0x3f] = '\0';
    src3[0x20] = '\0';
    src3[0x21] = '\0';
    src3[0x22] = '\0';
    src3[0x23] = '\0';
    src3[0x24] = '\0';
    src3[0x25] = '\0';
    src3[0x26] = '\0';
    src3[0x27] = '\0';
    src3[0x28] = '\0';
    src3[0x29] = '\0';
    src3[0x2a] = '\0';
    src3[0x2b] = '\0';
    src3[0x2c] = '\0';
    src3[0x2d] = '\0';
    src3[0x2e] = '\0';
    src3[0x2f] = '\0';
    src3[0x10] = '\0';
    src3[0x11] = '\0';
    src3[0x12] = '\0';
    src3[0x13] = '\0';
    src3[0x14] = '\0';
    src3[0x15] = '\0';
    src3[0x16] = '\0';
    src3[0x17] = '\0';
    src3[0x18] = '\0';
    src3[0x19] = '\0';
    src3[0x1a] = '\0';
    src3[0x1b] = '\0';
    src3[0x1c] = '\0';
    src3[0x1d] = '\0';
    src3[0x1e] = '\0';
    src3[0x1f] = '\0';
    src3[0] = '\0';
    src3[1] = '\0';
    src3[2] = '\0';
    src3[3] = '\0';
    src3[4] = '\0';
    src3[5] = '\0';
    src3[6] = '\0';
    src3[7] = '\0';
    src3[8] = '\0';
    src3[9] = '\0';
    src3[10] = '\0';
    src3[0xb] = '\0';
    src3[0xc] = '\0';
    src3[0xd] = '\0';
    src3[0xe] = '\0';
    src3[0xf] = '\0';
    if (pRVar5 == (RegisterList *)0x0) {
      pcVar7 = "TEXLD using undeclared sampler";
LAB_0011ec16:
      fail(ctx,pcVar7);
      return;
    }
    pcVar9 = "";
    pcVar7 = "";
    if (texldd != 0) {
      uVar1 = pRVar5->index;
      if (uVar1 == 4) {
        make_METAL_srcarg_string_vec3(ctx,2,src2,in_RCX);
        make_METAL_srcarg_string_vec3(ctx,3,src3,in_RCX);
        pcVar7 = "3d";
      }
      else if (uVar1 == 3) {
        make_METAL_srcarg_string_vec3(ctx,2,src2,in_RCX);
        make_METAL_srcarg_string_vec3(ctx,3,src3,in_RCX);
        pcVar7 = "cube";
      }
      else {
        pcVar7 = "";
        if (uVar1 == 2) {
          make_METAL_srcarg_string_vec2(ctx,2,src2,in_RCX);
          make_METAL_srcarg_string_vec2(ctx,3,src3,in_RCX);
          pcVar7 = "2d";
        }
      }
    }
    bias[0x30] = '\0';
    bias[0x31] = '\0';
    bias[0x32] = '\0';
    bias[0x33] = '\0';
    bias[0x34] = '\0';
    bias[0x35] = '\0';
    bias[0x36] = '\0';
    bias[0x37] = '\0';
    bias[0x38] = '\0';
    bias[0x39] = '\0';
    bias[0x3a] = '\0';
    bias[0x3b] = '\0';
    bias[0x3c] = '\0';
    bias[0x3d] = '\0';
    bias[0x3e] = '\0';
    bias[0x3f] = '\0';
    bias[0x20] = '\0';
    bias[0x21] = '\0';
    bias[0x22] = '\0';
    bias[0x23] = '\0';
    bias[0x24] = '\0';
    bias[0x25] = '\0';
    bias[0x26] = '\0';
    bias[0x27] = '\0';
    bias[0x28] = '\0';
    bias[0x29] = '\0';
    bias[0x2a] = '\0';
    bias[0x2b] = '\0';
    bias[0x2c] = '\0';
    bias[0x2d] = '\0';
    bias[0x2e] = '\0';
    bias[0x2f] = '\0';
    bias[0x10] = '\0';
    bias[0x11] = '\0';
    bias[0x12] = '\0';
    bias[0x13] = '\0';
    bias[0x14] = '\0';
    bias[0x15] = '\0';
    bias[0x16] = '\0';
    bias[0x17] = '\0';
    bias[0x18] = '\0';
    bias[0x19] = '\0';
    bias[0x1a] = '\0';
    bias[0x1b] = '\0';
    bias[0x1c] = '\0';
    bias[0x1d] = '\0';
    bias[0x1e] = '\0';
    bias[0x1f] = '\0';
    bias[0] = '\0';
    bias[1] = '\0';
    bias[2] = '\0';
    bias[3] = '\0';
    bias[4] = '\0';
    bias[5] = '\0';
    bias[6] = '\0';
    bias[7] = '\0';
    bias[8] = '\0';
    bias[9] = '\0';
    bias[10] = '\0';
    bias[0xb] = '\0';
    bias[0xc] = '\0';
    bias[0xd] = '\0';
    bias[0xe] = '\0';
    bias[0xf] = '\0';
    uVar3 = ctx->instruction_controls;
    pcVar6 = "";
    pcVar8 = "";
    if (uVar3 == 2) {
      make_METAL_srcarg_string_w(ctx,0,bias,0x1250a0);
      uVar3 = ctx->instruction_controls;
      pcVar8 = ")";
      pcVar6 = ", bias(";
    }
    proj[0x30] = '\0';
    proj[0x31] = '\0';
    proj[0x32] = '\0';
    proj[0x33] = '\0';
    proj[0x34] = '\0';
    proj[0x35] = '\0';
    proj[0x36] = '\0';
    proj[0x37] = '\0';
    proj[0x38] = '\0';
    proj[0x39] = '\0';
    proj[0x3a] = '\0';
    proj[0x3b] = '\0';
    proj[0x3c] = '\0';
    proj[0x3d] = '\0';
    proj[0x3e] = '\0';
    proj[0x3f] = '\0';
    proj[0x20] = '\0';
    proj[0x21] = '\0';
    proj[0x22] = '\0';
    proj[0x23] = '\0';
    proj[0x24] = '\0';
    proj[0x25] = '\0';
    proj[0x26] = '\0';
    proj[0x27] = '\0';
    proj[0x28] = '\0';
    proj[0x29] = '\0';
    proj[0x2a] = '\0';
    proj[0x2b] = '\0';
    proj[0x2c] = '\0';
    proj[0x2d] = '\0';
    proj[0x2e] = '\0';
    proj[0x2f] = '\0';
    proj[0x10] = '\0';
    proj[0x11] = '\0';
    proj[0x12] = '\0';
    proj[0x13] = '\0';
    proj[0x14] = '\0';
    proj[0x15] = '\0';
    proj[0x16] = '\0';
    proj[0x17] = '\0';
    proj[0x18] = '\0';
    proj[0x19] = '\0';
    proj[0x1a] = '\0';
    proj[0x1b] = '\0';
    proj[0x1c] = '\0';
    proj[0x1d] = '\0';
    proj[0x1e] = '\0';
    proj[0x1f] = '\0';
    proj[0] = '\0';
    proj[1] = '\0';
    proj[2] = '\0';
    proj[3] = '\0';
    proj[4] = '\0';
    proj[5] = '\0';
    proj[6] = '\0';
    proj[7] = '\0';
    proj[8] = '\0';
    proj[9] = '\0';
    proj[10] = '\0';
    proj[0xb] = '\0';
    proj[0xc] = '\0';
    proj[0xd] = '\0';
    proj[0xe] = '\0';
    proj[0xf] = '\0';
    if (uVar3 == 1) {
      pcVar9 = pcVar6;
      if (pRVar5->index == 3) {
        fail(ctx,"TEXLDP on a cubemap");
      }
      make_METAL_srcarg_string_w(ctx,0,proj,(size_t)pcVar9);
      pcVar9 = " / ";
    }
    uVar1 = pRVar5->index - 3;
    if (uVar1 < 2) {
      make_METAL_srcarg_string_vec3(ctx,0,src0,(ulong)uVar1);
    }
    else {
      if (pRVar5->index != 2) {
        pcVar7 = "unknown texture type";
        goto LAB_0011ec16;
      }
      make_METAL_srcarg_string_vec2(ctx,0,src0,(ulong)uVar1);
    }
    iVar2 = ctx->source_args[1].regnum;
    iVar4 = isscalar(ctx,ctx->shader_type,ctx->source_args[1].regtype,iVar2);
    if (iVar4 != 0) {
      __assert_fail("!isscalar(ctx, ctx->shader_type, samp_arg->regtype, samp_arg->regnum)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                    ,0x16ba,"void metal_texld(Context *, const int)");
    }
    swiz_str[4] = '\0';
    swiz_str[5] = '\0';
    swiz_str[0] = '\0';
    swiz_str[1] = '\0';
    swiz_str[2] = '\0';
    swiz_str[3] = '\0';
    make_METAL_swizzle_string
              (swiz_str,(ulong)(uint)ctx->source_args[1].swizzle,(ctx->dest_arg).writemask,iVar2);
    if (texldd == 0) {
      make_METAL_destarg_assign
                (ctx,code,0x80,"%s_texture.sample(%s, %s%s%s%s%s%s)%s",src1,src1,src0,pcVar9,proj,
                 pcVar6,bias,pcVar8,swiz_str);
    }
    else {
      make_METAL_destarg_assign
                (ctx,code,0x80,"%s_texture.sample(%s, %s, gradient%s(%s, %s))%s",src1,src1,src0,
                 pcVar7,src2,src3,swiz_str);
    }
  }
  output_line(ctx,"%s",code);
  return;
}

Assistant:

static void metal_texld(Context *ctx, const int texldd)
{
    ctx->metal_need_header_texture = 1;
    if (!shader_version_atleast(ctx, 1, 4))
    {
        DestArgInfo *info = &ctx->dest_arg;
        char dst[64];
        char sampler[64];
        char code[128] = {0};

        assert(!texldd);

        RegisterList *sreg;
        sreg = reglist_find(&ctx->samplers, REG_TYPE_SAMPLER, info->regnum);
        const TextureType ttype = (TextureType) (sreg ? sreg->index : 0);

        char swizzle[4] = { 'x', 'y', 'z', '\0' };
        if (ttype == TEXTURE_TYPE_2D)
            swizzle[2] = '\0';  // "xy" instead of "xyz".

        // !!! FIXME: this code counts on the register not having swizzles, etc.
        get_METAL_destarg_varname(ctx, dst, sizeof (dst));
        get_METAL_varname_in_buf(ctx, REG_TYPE_SAMPLER, info->regnum,
                                 sampler, sizeof (sampler));

        make_METAL_destarg_assign(ctx, code, sizeof (code),
                                  "%s_texture.sample(%s, %s.%s)",
                                  sampler, sampler, dst, swizzle);
        output_line(ctx, "%s", code);
    } // if

    else if (!shader_version_atleast(ctx, 2, 0))
    {
        // ps_1_4 is different, too!
        fail(ctx, "TEXLD == Shader Model 1.4 unimplemented.");  // !!! FIXME
        return;
    } // else if

    else
    {
        const SourceArgInfo *samp_arg = &ctx->source_args[1];
        RegisterList *sreg = reglist_find(&ctx->samplers, REG_TYPE_SAMPLER,
                                          samp_arg->regnum);
        const char *funcname = NULL;
        char src0[64] = { '\0' };
        char src1[64]; get_METAL_srcarg_varname(ctx, 1, src1, sizeof (src1)); // !!! FIXME: SRC_MOD?
        char src2[64] = { '\0' };
        char src3[64] = { '\0' };

        if (sreg == NULL)
        {
            fail(ctx, "TEXLD using undeclared sampler");
            return;
        } // if

        const char *grad = "";
        if (texldd)
        {
            switch ((const TextureType) sreg->index)
            {
                case TEXTURE_TYPE_2D:
                    grad = "2d";
                    make_METAL_srcarg_string_vec2(ctx, 2, src2, sizeof (src2));
                    make_METAL_srcarg_string_vec2(ctx, 3, src3, sizeof (src3));
                    break;
                case TEXTURE_TYPE_VOLUME:
                    grad = "3d";
                    make_METAL_srcarg_string_vec3(ctx, 2, src2, sizeof (src2));
                    make_METAL_srcarg_string_vec3(ctx, 3, src3, sizeof (src3));
                    break;
                case TEXTURE_TYPE_CUBE:
                    grad = "cube";
                    make_METAL_srcarg_string_vec3(ctx, 2, src2, sizeof (src2));
                    make_METAL_srcarg_string_vec3(ctx, 3, src3, sizeof (src3));
                    break;
            } // switch
        } // if

        // !!! FIXME: can TEXLDD set instruction_controls?
        // !!! FIXME: does the d3d bias value map directly to Metal?
        const char *biasleft = "";
        const char *biasright = "";
        char bias[64] = { '\0' };
        if (ctx->instruction_controls == CONTROL_TEXLDB)
        {
            biasleft = ", bias(";
            make_METAL_srcarg_string_w(ctx, 0, bias, sizeof (bias));
            biasright = ")";
        } // if

        // Metal doesn't have a texture2DProj() function, but you just divide
        // your texcoords by texcoords.w to achieve it anyhow, so DIY.
        const char *projop = "";
        char proj[64] = { '\0' };
        if (ctx->instruction_controls == CONTROL_TEXLDP)
        {
            if (sreg->index == TEXTURE_TYPE_CUBE)
                fail(ctx, "TEXLDP on a cubemap");  // !!! FIXME: is this legal?
            projop = " / ";
            make_METAL_srcarg_string_w(ctx, 0, proj, sizeof (proj));
        } // if

        switch ((const TextureType) sreg->index)
        {
            case TEXTURE_TYPE_2D:
                make_METAL_srcarg_string_vec2(ctx, 0, src0, sizeof (src0));
                break;

            case TEXTURE_TYPE_CUBE:
            case TEXTURE_TYPE_VOLUME:
                make_METAL_srcarg_string_vec3(ctx, 0, src0, sizeof (src0));
                break;

            default:
                fail(ctx, "unknown texture type");
                return;
        } // switch

        assert(!isscalar(ctx, ctx->shader_type, samp_arg->regtype, samp_arg->regnum));
        char swiz_str[6] = { '\0' };
        make_METAL_swizzle_string(swiz_str, sizeof (swiz_str),
                                 samp_arg->swizzle, ctx->dest_arg.writemask);

        char code[128];
        if (texldd)
        {
            make_METAL_destarg_assign(ctx, code, sizeof (code),
                                     "%s_texture.sample(%s, %s, gradient%s(%s, %s))%s",
                                     src1, src1, src0, grad, src2, src3, swiz_str);
        } // if
        else
        {
            make_METAL_destarg_assign(ctx, code, sizeof (code),
                                     "%s_texture.sample(%s, %s%s%s%s%s%s)%s",
                                     src1, src1, src0, projop, proj,
                                     biasleft, bias, biasright, swiz_str);
        } // else

        output_line(ctx, "%s", code);
    } // else
}